

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-source-line-finder.cc
# Opt level: O1

OffsetRange __thiscall
wabt::LexerSourceLineFinder::ClampSourceLineOffsets
          (LexerSourceLineFinder *this,OffsetRange offset_range,ColumnRange column_range,
          Offset max_line_length)

{
  unsigned_long uVar1;
  int iVar2;
  long lVar3;
  OffsetRange OVar5;
  LexerSourceLineFinder *pLVar4;
  
  iVar2 = (int)offset_range.end;
  uVar1 = offset_range.start;
  if ((ulong)column_range < uVar1 - (long)this) {
    if ((ulong)(long)(offset_range.end._4_4_ - iVar2) <= (ulong)column_range) {
      iVar2 = (offset_range.end._4_4_ + iVar2) / 2;
    }
    lVar3 = 0;
    if ((ulong)column_range >> 1 <= (ulong)(long)(iVar2 + -1)) {
      lVar3 = (long)(iVar2 + -1) - ((ulong)column_range >> 1);
    }
    pLVar4 = (LexerSourceLineFinder *)
             ((long)&(this->source_)._M_t.
                     super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>
                     .super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl + lVar3);
    this = (LexerSourceLineFinder *)(uVar1 - (long)column_range);
    if (pLVar4 <= (LexerSourceLineFinder *)(uVar1 - (long)column_range)) {
      this = pLVar4;
    }
    uVar1 = (long)&(this->source_)._M_t.
                   super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>
                   .super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl +
            (long)column_range;
  }
  OVar5.end = uVar1;
  OVar5.start = (unsigned_long)this;
  return OVar5;
}

Assistant:

OffsetRange LexerSourceLineFinder::ClampSourceLineOffsets(
    OffsetRange offset_range,
    ColumnRange column_range,
    Offset max_line_length) {
  Offset line_length = offset_range.size();
  if (line_length > max_line_length) {
    size_t column_count = column_range.size();
    size_t center_on;
    if (column_count > max_line_length) {
      // The column range doesn't fit, just center on first_column.
      center_on = column_range.start - 1;
    } else {
      // the entire range fits, display it all in the center.
      center_on = (column_range.start + column_range.end) / 2 - 1;
    }
    if (center_on > max_line_length / 2) {
      offset_range.start += center_on - max_line_length / 2;
    }
    offset_range.start =
        std::min(offset_range.start, offset_range.end - max_line_length);
    offset_range.end = offset_range.start + max_line_length;
  }

  return offset_range;
}